

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall
QAbstractScrollAreaPrivate::replaceScrollBar
          (QAbstractScrollAreaPrivate *this,QScrollBar *scrollBar,Orientation orientation)

{
  QAbstractScrollAreaScrollBarContainer *pQVar1;
  bool bVar2;
  QAbstractScrollArea *pQVar3;
  QAbstractScrollAreaScrollBarContainer **ppQVar4;
  QScrollBarPrivate *pQVar5;
  int in_EDX;
  QWidget *in_RSI;
  QAbstractScrollAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QScrollBar *oldBar;
  bool horizontal;
  QAbstractScrollAreaScrollBarContainer *container;
  QAbstractScrollArea *q;
  Orientation in_stack_fffffffffffffeec;
  undefined1 enable;
  QAbstractSlider *in_stack_fffffffffffffef0;
  QObject *pQVar6;
  undefined8 in_stack_fffffffffffffef8;
  Orientation orientation_00;
  ConnectionType CVar7;
  QWidget *in_stack_ffffffffffffff00;
  QWidget *in_stack_ffffffffffffff08;
  QWidget *in_stack_ffffffffffffff10;
  int stretch;
  QWidget *pQVar8;
  undefined8 in_stack_ffffffffffffff28;
  int iVar9;
  QBoxLayout *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QObject local_20 [8];
  QObject local_18 [12];
  undefined1 local_c [4];
  long local_8;
  
  orientation_00 = (Orientation)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  alignment.i = (Int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  iVar9 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  ppQVar4 = QHVContainer<QAbstractScrollAreaScrollBarContainer_*>::operator[]
                      ((QHVContainer<QAbstractScrollAreaScrollBarContainer_*> *)
                       in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  pQVar1 = *ppQVar4;
  if (in_EDX != 1) {
    pQVar6 = (QObject *)in_RDI->vbar;
    in_RDI->vbar = (QScrollBar *)in_RSI;
  }
  else {
    pQVar6 = (QObject *)in_RDI->hbar;
    in_RDI->hbar = (QScrollBar *)in_RSI;
  }
  QWidget::setParent(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  pQVar1->scrollBar = (QScrollBar *)in_RSI;
  QLayout::removeWidget((QLayout *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  stretch = (int)((ulong)pQVar1->layout >> 0x20);
  pQVar8 = in_RSI;
  memset(local_c,0,4);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x4953cf);
  QBoxLayout::insertWidget(in_stack_ffffffffffffff30,iVar9,pQVar8,stretch,(Alignment)alignment.i);
  pQVar8 = in_RSI;
  bVar2 = QWidget::isVisibleTo(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  (**(code **)(*(long *)pQVar8 + 0x68))(pQVar8,bVar2);
  QAbstractSlider::invertedAppearance(in_stack_fffffffffffffef0);
  QAbstractSlider::setInvertedAppearance
            ((QAbstractSlider *)in_stack_ffffffffffffff00,SUB41(orientation_00 >> 0x18,0));
  QAbstractSlider::invertedControls(in_stack_fffffffffffffef0);
  QAbstractSlider::setInvertedControls
            (in_stack_fffffffffffffef0,SUB41(in_stack_fffffffffffffeec >> 0x18,0));
  QAbstractSlider::minimum(in_stack_fffffffffffffef0);
  QAbstractSlider::maximum(in_stack_fffffffffffffef0);
  QAbstractSlider::setRange
            ((QAbstractSlider *)in_stack_ffffffffffffff00,
             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08);
  QAbstractSlider::orientation(in_stack_fffffffffffffef0);
  QAbstractSlider::setOrientation((QAbstractSlider *)in_stack_ffffffffffffff00,orientation_00);
  QAbstractSlider::pageStep(in_stack_fffffffffffffef0);
  QAbstractSlider::setPageStep(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  QAbstractSlider::singleStep(in_stack_fffffffffffffef0);
  QAbstractSlider::setSingleStep(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  enable = (undefined1)(in_stack_fffffffffffffeec >> 0x18);
  pQVar5 = QScrollBar::d_func((QScrollBar *)0x495530);
  bVar2 = (pQVar5->super_QAbstractSliderPrivate).viewMayChangeSingleStep;
  pQVar5 = QScrollBar::d_func((QScrollBar *)0x49554a);
  (pQVar5->super_QAbstractSliderPrivate).viewMayChangeSingleStep = (bool)(bVar2 & 1);
  QAbstractSlider::isSliderDown(in_stack_fffffffffffffef0);
  QAbstractSlider::setSliderDown
            ((QAbstractSlider *)in_stack_ffffffffffffff00,SUB41(orientation_00 >> 0x18,0));
  QAbstractSlider::sliderPosition(in_stack_fffffffffffffef0);
  QAbstractSlider::setSliderPosition((QAbstractSlider *)in_stack_ffffffffffffff00,orientation_00);
  iVar9 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  QAbstractSlider::hasTracking(in_stack_fffffffffffffef0);
  QAbstractSlider::setTracking(in_stack_fffffffffffffef0,(bool)enable);
  QAbstractSlider::value(in_stack_fffffffffffffef0);
  QAbstractSlider::setValue((QAbstractSlider *)in_stack_ffffffffffffff08,iVar9);
  QObject::installEventFilter(&in_RSI->super_QObject);
  QObject::removeEventFilter(pQVar6);
  if (pQVar6 != (QObject *)0x0) {
    (**(code **)(*(long *)pQVar6 + 0x20))();
  }
  if (in_EDX != 1) {
    CVar7 = 0xab27f3;
  }
  else {
    CVar7 = 0xab27e3;
  }
  pQVar6 = local_18;
  QObject::connect(pQVar6,(char *)in_RSI,(QObject *)"2valueChanged(int)",(char *)pQVar3,CVar7);
  QMetaObject::Connection::~Connection((Connection *)pQVar6);
  pQVar6 = local_20;
  QObject::connect(pQVar6,(char *)in_RSI,(QObject *)"2rangeChanged(int,int)",(char *)pQVar3,0xab281a
                  );
  QMetaObject::Connection::~Connection((Connection *)pQVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractScrollAreaPrivate::replaceScrollBar(QScrollBar *scrollBar,
                                                  Qt::Orientation orientation)
{
    Q_Q(QAbstractScrollArea);

    QAbstractScrollAreaScrollBarContainer *container = scrollBarContainers[orientation];
    bool horizontal = (orientation == Qt::Horizontal);
    QScrollBar *oldBar = horizontal ? hbar : vbar;
    if (horizontal)
        hbar = scrollBar;
    else
        vbar = scrollBar;
    scrollBar->setParent(container);
    container->scrollBar = scrollBar;
    container->layout->removeWidget(oldBar);
    container->layout->insertWidget(0, scrollBar);
    scrollBar->setVisible(oldBar->isVisibleTo(container));
    scrollBar->setInvertedAppearance(oldBar->invertedAppearance());
    scrollBar->setInvertedControls(oldBar->invertedControls());
    scrollBar->setRange(oldBar->minimum(), oldBar->maximum());
    scrollBar->setOrientation(oldBar->orientation());
    scrollBar->setPageStep(oldBar->pageStep());
    scrollBar->setSingleStep(oldBar->singleStep());
    scrollBar->d_func()->viewMayChangeSingleStep = oldBar->d_func()->viewMayChangeSingleStep;
    scrollBar->setSliderDown(oldBar->isSliderDown());
    scrollBar->setSliderPosition(oldBar->sliderPosition());
    scrollBar->setTracking(oldBar->hasTracking());
    scrollBar->setValue(oldBar->value());
    scrollBar->installEventFilter(q);
    oldBar->removeEventFilter(q);
    delete oldBar;

    QObject::connect(scrollBar, SIGNAL(valueChanged(int)),
                     q, horizontal ? SLOT(_q_hslide(int)) : SLOT(_q_vslide(int)));
    QObject::connect(scrollBar, SIGNAL(rangeChanged(int,int)),
                     q, SLOT(_q_showOrHideScrollBars()), Qt::QueuedConnection);
}